

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

bool bk_lib::operator==(pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *lhs,
                       pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *rhs)

{
  uint uVar1;
  Literal *__first1;
  bool bVar2;
  
  uVar1 = (lhs->ebo_).size;
  if (uVar1 == (rhs->ebo_).size) {
    __first1 = (lhs->ebo_).buf;
    bVar2 = std::__equal<false>::equal<Clasp::Literal_const*,Clasp::Literal_const*>
                      (__first1,__first1 + uVar1,(rhs->ebo_).buf);
    return bVar2;
  }
  return false;
}

Assistant:

size_type size()     const { return ebo_.size; }